

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::NotLikeOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  idx_t iVar9;
  unsigned_long uVar10;
  long lVar11;
  ulong uVar12;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  ulong local_60;
  string_t *local_58;
  bool *local_50;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_60 = count;
  local_58 = rdata;
  local_50 = result_data;
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar11 = 8;
      iVar9 = 0;
      do {
        local_70 = *(ulong *)((long)ldata + lVar11 + -8);
        local_68 = *(char **)((long)&ldata->value + lVar11);
        local_80 = *(ulong *)((long)local_58 + lVar11 + -8);
        local_78 = *(char **)((long)&local_58->value + lVar11);
        pcVar7 = local_68;
        if ((local_70 & 0xffffffff) < 0xd) {
          pcVar7 = (char *)((long)&local_70 + 4);
        }
        pcVar3 = local_78;
        if ((local_80 & 0xffffffff) < 0xd) {
          pcVar3 = (char *)((long)&local_80 + 4);
        }
        bVar2 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                          (pcVar7,local_70 & 0xffffffff,pcVar3,local_80 & 0xffffffff,'\0');
        local_50[iVar9] = !bVar2;
        iVar9 = iVar9 + 1;
        lVar11 = lVar11 + 0x10;
      } while (local_60 != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    local_38 = 0;
    uVar5 = 0;
    do {
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar1[local_38];
      }
      uVar8 = uVar5 + 0x40;
      if (local_60 <= uVar5 + 0x40) {
        uVar8 = local_60;
      }
      uVar6 = uVar8;
      if (uVar10 != 0) {
        uVar6 = uVar5;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar5 < uVar8) {
            uVar4 = uVar5 << 4 | 8;
            do {
              local_70 = *(ulong *)((long)ldata + (uVar4 - 8));
              local_68 = *(char **)((long)&ldata->value + uVar4);
              local_80 = *(ulong *)((long)local_58 + (uVar4 - 8));
              local_78 = *(char **)((long)&local_58->value + uVar4);
              pcVar7 = local_68;
              if ((local_70 & 0xffffffff) < 0xd) {
                pcVar7 = (char *)((long)&local_70 + 4);
              }
              pcVar3 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar3 = (char *)((long)&local_80 + 4);
              }
              bVar2 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                (pcVar7,local_70 & 0xffffffff,pcVar3,local_80 & 0xffffffff,'\0');
              local_50[uVar5] = !bVar2;
              uVar5 = uVar5 + 1;
              uVar4 = uVar4 + 0x10;
              uVar6 = uVar5;
            } while (uVar8 != uVar5);
          }
        }
        else if (uVar5 < uVar8) {
          uVar4 = uVar5 << 4 | 8;
          uVar12 = 0;
          do {
            if ((uVar10 >> (uVar12 & 0x3f) & 1) != 0) {
              local_70 = *(ulong *)((long)ldata + (uVar4 - 8));
              local_68 = *(char **)((long)&ldata->value + uVar4);
              local_80 = *(ulong *)((long)local_58 + (uVar4 - 8));
              local_78 = *(char **)((long)&local_58->value + uVar4);
              pcVar7 = local_68;
              if ((local_70 & 0xffffffff) < 0xd) {
                pcVar7 = (char *)((long)&local_70 + 4);
              }
              pcVar3 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar3 = (char *)((long)&local_80 + 4);
              }
              bVar2 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                (pcVar7,local_70 & 0xffffffff,pcVar3,local_80 & 0xffffffff,'\0');
              local_50[uVar5] = !bVar2;
            }
            uVar5 = uVar5 + 1;
            uVar4 = uVar4 + 0x10;
            uVar12 = uVar12 + 1;
            uVar6 = uVar5;
          } while (uVar8 != uVar5);
        }
      }
      local_38 = local_38 + 1;
      uVar5 = uVar6;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}